

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O3

mallinfo * mallinfo(void)

{
  mchunkptr pmVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  mallinfo *in_RDI;
  size_t sVar5;
  malloc_segment *pmVar6;
  uint uVar7;
  ulong uVar8;
  mchunkptr pmVar9;
  ulong uVar10;
  
  in_RDI->fordblks = 0;
  in_RDI->keepcost = 0;
  in_RDI->fsmblks = 0;
  in_RDI->uordblks = 0;
  in_RDI->hblkhd = 0;
  in_RDI->usmblks = 0;
  in_RDI->smblks = 0;
  in_RDI->hblks = 0;
  in_RDI->arena = 0;
  in_RDI->ordblks = 0;
  if (mparams.magic == 0) {
    init_mparams();
  }
  sVar2 = _gm_.topsize;
  if (_gm_.top != (mchunkptr)0x0) {
    sVar3 = _gm_.topsize + 0x50;
    pmVar6 = &_gm_.seg;
    sVar5 = 1;
    sVar4 = sVar3;
    do {
      pmVar1 = (mchunkptr)pmVar6->base;
      uVar7 = (int)pmVar1 + 0x10;
      uVar8 = (ulong)(-uVar7 & 0xf);
      if ((uVar7 & 0xf) == 0) {
        uVar8 = 0;
      }
      pmVar9 = (mchunkptr)((long)&pmVar1->prev_foot + uVar8);
      do {
        if (((pmVar9 == _gm_.top) ||
            ((mchunkptr)((long)&pmVar1->prev_foot + pmVar6->size) <= pmVar9)) ||
           (uVar8 = pmVar9->head, uVar8 == 0xb)) break;
        uVar10 = uVar8 & 0xfffffffffffffff8;
        sVar3 = sVar3 + uVar10;
        uVar7 = (uint)uVar8 & 3;
        uVar8 = 0;
        if (uVar7 == 1) {
          uVar8 = uVar10;
        }
        sVar4 = sVar4 + uVar8;
        sVar5 = sVar5 + (uVar7 == 1);
        pmVar9 = (mchunkptr)((long)&pmVar9->prev_foot + uVar10);
      } while (pmVar1 <= pmVar9);
      pmVar6 = pmVar6->next;
    } while (pmVar6 != (malloc_segment *)0x0);
    in_RDI->arena = sVar3;
    in_RDI->ordblks = sVar5;
    sVar5 = _gm_.footprint;
    in_RDI->hblkhd = _gm_.footprint - sVar3;
    in_RDI->usmblks = _gm_.max_footprint;
    in_RDI->uordblks = sVar5 - sVar4;
    in_RDI->fordblks = sVar4;
    in_RDI->keepcost = sVar2;
  }
  return in_RDI;
}

Assistant:

struct mallinfo dlmallinfo(void) {
  return internal_mallinfo(gm);
}